

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkIf
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeIf *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeIf *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        pnode->pnodeCond,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,local_21);
  if (bVar1) {
    local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                         ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                          (ParseNode *)pnode,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_21);
    if (bVar1) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            pnode->pnodeTrue,context);
      bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                        (&this->super_WalkerPolicyTest,local_21);
      if ((bVar1) && (pnode->pnodeFalse != (ParseNodePtr)0x0)) {
        local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                             ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                              (ParseNode *)pnode,pnode->pnodeFalse,context);
      }
    }
  }
  return local_21;
}

Assistant:

ResultType WalkIf(ParseNodeIf *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnodeCond, context);
        if (ContinueWalk(result))
        {
            result = WalkNode(pnode, context);
            if (ContinueWalk(result))
            {
                result = WalkSecondChild(pnode->pnodeTrue, context);
                if (ContinueWalk(result) && pnode->pnodeFalse)
                    result = WalkNthChild(pnode, pnode->pnodeFalse, context);
            }
        }
        return result;
    }